

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2cell_id.h
# Opt level: O0

int __thiscall S2CellId::GetCenterSiTi(S2CellId *this,int *psi,int *pti)

{
  bool bVar1;
  int iVar2;
  int local_3c;
  int delta;
  int face;
  int j;
  int i;
  int *pti_local;
  int *psi_local;
  S2CellId *this_local;
  
  _j = pti;
  pti_local = psi;
  psi_local = (int *)this;
  iVar2 = ToFaceIJOrientation(this,&face,&delta,(int *)0x0);
  bVar1 = is_leaf(this);
  if (bVar1) {
    local_3c = 1;
  }
  else {
    local_3c = 0;
    if (((face ^ (int)this->id_ >> 2) & 1U) != 0) {
      local_3c = 2;
    }
  }
  *pti_local = face * 2 + local_3c;
  *_j = delta * 2 + local_3c;
  return iVar2;
}

Assistant:

inline int S2CellId::GetCenterSiTi(int* psi, int* pti) const {
  // First we compute the discrete (i,j) coordinates of a leaf cell contained
  // within the given cell.  Given that cells are represented by the Hilbert
  // curve position corresponding at their center, it turns out that the cell
  // returned by ToFaceIJOrientation is always one of two leaf cells closest
  // to the center of the cell (unless the given cell is a leaf cell itself,
  // in which case there is only one possibility).
  //
  // Given a cell of size s >= 2 (i.e. not a leaf cell), and letting (imin,
  // jmin) be the coordinates of its lower left-hand corner, the leaf cell
  // returned by ToFaceIJOrientation() is either (imin + s/2, jmin + s/2)
  // (imin + s/2 - 1, jmin + s/2 - 1).  The first case is the one we want.
  // We can distinguish these two cases by looking at the low bit of "i" or
  // "j".  In the second case the low bit is one, unless s == 2 (i.e. the
  // level just above leaf cells) in which case the low bit is zero.
  //
  // In the code below, the expression ((i ^ (int(id_) >> 2)) & 1) is true
  // if we are in the second case described above.
  int i, j;
  int face = ToFaceIJOrientation(&i, &j, nullptr);
  int delta = is_leaf() ? 1 : ((i ^ (static_cast<int>(id_) >> 2)) & 1) ? 2 : 0;

  // Note that (2 * {i,j} + delta) will never overflow a 32-bit integer.
  *psi = 2 * i + delta;
  *pti = 2 * j + delta;
  return face;
}